

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O1

void __thiscall
soplex::SVSetBase<double>::updateUnusedMemEstimation(SVSetBase<double> *this,int change)

{
  int iVar1;
  DLPSV *pDVar2;
  int iVar3;
  DLPSV *pDVar4;
  
  iVar1 = this->numUnusedMemUpdates;
  iVar3 = change + this->unusedMem;
  this->unusedMem = iVar3;
  this->numUnusedMemUpdates = iVar1 + 1;
  if ((iVar3 < 0) ||
     (0xf423e < iVar1 || (this->super_ClassArray<soplex::Nonzero<double>_>).thesize < iVar3)) {
    iVar1 = (this->super_ClassArray<soplex::Nonzero<double>_>).thesize;
    this->unusedMem = iVar1;
    pDVar2 = (this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_first;
    if (pDVar2 != (DLPSV *)0x0) {
      do {
        if ((this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_last == pDVar2) {
          pDVar4 = (DLPSV *)0x0;
        }
        else {
          pDVar4 = pDVar2->thenext;
        }
        iVar1 = iVar1 - (pDVar2->super_SVectorBase<double>).memused;
        pDVar2 = pDVar4;
      } while (pDVar4 != (DLPSV *)0x0);
      this->unusedMem = iVar1;
    }
    this->numUnusedMemUpdates = 0;
  }
  return;
}

Assistant:

void updateUnusedMemEstimation(int change)
   {
      unusedMem += change;
      numUnusedMemUpdates++;

      if(unusedMem < 0 || unusedMem > memSize() || numUnusedMemUpdates >= 1000000)
         countUnusedMem();
   }